

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O0

WRAP_CHAR * make_absolute_path(char *tail)

{
  WRAP_CHAR *pWVar1;
  WRAP_CHAR *abs_path;
  WRAP_CHAR *in_stack_00001000;
  
  pWVar1 = make_absolute_path_inner(in_stack_00001000);
  return pWVar1;
}

Assistant:

static WRAP_CHAR *make_absolute_path(const char *tail)
{
   WRAP_CHAR *abs_path = NULL;
#ifdef ALLEGRO_WINDOWS
   wchar_t *wtail = _al_win_utf8_to_utf16(tail);
   if (wtail) {
      abs_path = make_absolute_path_inner(wtail);
      al_free(wtail);
   }
#else
   abs_path = make_absolute_path_inner(tail);
#endif
   return abs_path;
}